

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

void __thiscall
VmaSmallVector<VkMappedMemoryRange,_VmaStlAllocator<VkMappedMemoryRange>,_16UL>::resize
          (VmaSmallVector<VkMappedMemoryRange,_VmaStlAllocator<VkMappedMemoryRange>,_16UL> *this,
          size_t newCount,bool freeMemory)

{
  ulong uVar1;
  size_t newCount_00;
  
  uVar1 = this->m_Count;
  newCount_00 = newCount;
  if (uVar1 < 0x11 || newCount < 0x11) {
    if (uVar1 < 0x11 && 0x10 < newCount) {
      VmaVector<VkMappedMemoryRange,_VmaStlAllocator<VkMappedMemoryRange>_>::resize
                (&this->m_DynamicArray,newCount);
      if (this->m_Count != 0) {
        memcpy((this->m_DynamicArray).m_pArray,this->m_StaticArray,this->m_Count * 0x28);
      }
      goto LAB_001c4772;
    }
    if (0x10 < newCount || uVar1 < 0x11) goto LAB_001c4772;
    if (newCount != 0) {
      memcpy(this->m_StaticArray,(this->m_DynamicArray).m_pArray,newCount * 0x28);
    }
    newCount_00 = 0;
  }
  VmaVector<VkMappedMemoryRange,_VmaStlAllocator<VkMappedMemoryRange>_>::resize
            (&this->m_DynamicArray,newCount_00);
  if (freeMemory) {
    VmaVector<VkMappedMemoryRange,_VmaStlAllocator<VkMappedMemoryRange>_>::shrink_to_fit
              (&this->m_DynamicArray);
  }
LAB_001c4772:
  this->m_Count = newCount;
  return;
}

Assistant:

void VmaSmallVector<T, AllocatorT, N>::resize(size_t newCount, bool freeMemory)
{
    if (newCount > N && m_Count > N)
    {
        // Any direction, staying in m_DynamicArray
        m_DynamicArray.resize(newCount);
        if (freeMemory)
        {
            m_DynamicArray.shrink_to_fit();
        }
    }
    else if (newCount > N && m_Count <= N)
    {
        // Growing, moving from m_StaticArray to m_DynamicArray
        m_DynamicArray.resize(newCount);
        if (m_Count > 0)
        {
            memcpy(m_DynamicArray.data(), m_StaticArray, m_Count * sizeof(T));
        }
    }
    else if (newCount <= N && m_Count > N)
    {
        // Shrinking, moving from m_DynamicArray to m_StaticArray
        if (newCount > 0)
        {
            memcpy(m_StaticArray, m_DynamicArray.data(), newCount * sizeof(T));
        }
        m_DynamicArray.resize(0);
        if (freeMemory)
        {
            m_DynamicArray.shrink_to_fit();
        }
    }
    else
    {
        // Any direction, staying in m_StaticArray - nothing to do here
    }
    m_Count = newCount;
}